

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int lj_ffh_bit_tobit(lua_State *L)

{
  long lVar1;
  uint64_t uVar2;
  long in_RDI;
  CTypeID *unaff_retaddr;
  CTypeID id;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  uVar2 = lj_carith_check64(L,id,unaff_retaddr);
  *(double *)(lVar1 + -8) = (double)(int)uVar2;
  return 2;
}

Assistant:

LJLIB_ASM(bit_tobit)		LJLIB_REC(bit_tobit)
{
#if LJ_HASFFI
  CTypeID id = 0;
  setintV(L->base-1-LJ_FR2, (int32_t)lj_carith_check64(L, 1, &id));
  return FFH_RES(1);
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}